

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p.c
# Opt level: O2

int envy_bios_parse_p_falcon_ucode(envy_bios *bios)

{
  uint8_t *res;
  undefined2 *puVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  envy_bios_p_falcon_ucode_entry *peVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  
  uVar3 = (bios->p).falcon_ucode.offset;
  iVar4 = -0x16;
  if (uVar3 != 0) {
    bios_u8(bios,(uint)uVar3,&(bios->p).falcon_ucode.version);
    if ((bios->p).falcon_ucode.version == '\x01') {
      iVar4 = bios_u8(bios,(bios->p).falcon_ucode.offset + 1,&(bios->p).falcon_ucode.hlen);
      iVar5 = bios_u8(bios,(bios->p).falcon_ucode.offset + 2,&(bios->p).falcon_ucode.rlen);
      res = &(bios->p).falcon_ucode.entriesnum;
      iVar6 = bios_u8(bios,(bios->p).falcon_ucode.offset + 3,res);
      iVar7 = bios_u8(bios,(bios->p).falcon_ucode.offset + 4,&(bios->p).falcon_ucode.desc_version);
      iVar8 = bios_u8(bios,(bios->p).falcon_ucode.offset + 5,&(bios->p).falcon_ucode.desc_size);
      (bios->p).falcon_ucode.valid =
           iVar8 == 0 && ((iVar7 == 0 && iVar6 == 0) && (iVar5 == 0 && iVar4 == 0));
      bVar2 = (bios->p).falcon_ucode.entriesnum;
      peVar21 = (envy_bios_p_falcon_ucode_entry *)malloc((ulong)bVar2 << 6);
      (bios->p).falcon_ucode.entries = peVar21;
      lVar23 = 0;
      uVar24 = 0;
      for (uVar22 = 0; uVar22 < bVar2; uVar22 = uVar22 + 1) {
        iVar4 = (uint)(bios->p).falcon_ucode.hlen + (uint)(bios->p).falcon_ucode.offset;
        iVar5 = (uint)(bios->p).falcon_ucode.rlen * (int)uVar22;
        puVar1 = (undefined2 *)((long)&peVar21->offset + lVar23);
        *puVar1 = (short)(iVar4 + iVar5);
        uVar9 = bios_u8(bios,iVar4 + iVar5,(uint8_t *)(puVar1 + 1));
        uVar10 = bios_u8(bios,iVar4 + iVar5 + 1,
                         &((bios->p).falcon_ucode.entries)->target_id + lVar23);
        uVar11 = bios_u32(bios,iVar4 + iVar5 + 2,
                          (uint32_t *)((long)&((bios->p).falcon_ucode.entries)->desc_ptr + lVar23));
        uVar24 = uVar11 | uVar10 | uVar9 | uVar24;
        peVar21 = (bios->p).falcon_ucode.entries;
        uVar9 = *(uint *)((long)&peVar21->desc_ptr + lVar23);
        if (uVar9 != 0) {
          *(uint *)((long)&(peVar21->desc).offset + lVar23) = uVar9;
          uVar10 = bios_u32(bios,uVar9,(uint32_t *)((long)&(peVar21->desc).stored_size + lVar23));
          uVar11 = bios_u32(bios,uVar9 + 4,
                            (uint32_t *)
                            ((long)&(((bios->p).falcon_ucode.entries)->desc).uncompressed_size +
                            lVar23));
          uVar12 = bios_u32(bios,uVar9 + 8,
                            (uint32_t *)
                            ((long)&(((bios->p).falcon_ucode.entries)->desc).virtual_entry + lVar23)
                           );
          uVar13 = bios_u32(bios,uVar9 + 0xc,
                            (uint32_t *)
                            ((long)&(((bios->p).falcon_ucode.entries)->desc).interface_offset +
                            lVar23));
          uVar14 = bios_u32(bios,uVar9 + 0x10,
                            (uint32_t *)
                            ((long)&(((bios->p).falcon_ucode.entries)->desc).imem_phys_base + lVar23
                            ));
          uVar15 = bios_u32(bios,uVar9 + 0x14,
                            (uint32_t *)
                            ((long)&(((bios->p).falcon_ucode.entries)->desc).imem_load_size + lVar23
                            ));
          uVar16 = bios_u32(bios,uVar9 + 0x18,
                            (uint32_t *)
                            ((long)&(((bios->p).falcon_ucode.entries)->desc).imem_virt_base + lVar23
                            ));
          uVar17 = bios_u32(bios,uVar9 + 0x1c,
                            (uint32_t *)
                            ((long)&(((bios->p).falcon_ucode.entries)->desc).imem_sec_base + lVar23)
                           );
          uVar18 = bios_u32(bios,uVar9 + 0x20,
                            (uint32_t *)
                            ((long)&(((bios->p).falcon_ucode.entries)->desc).imem_sec_size + lVar23)
                           );
          uVar19 = bios_u32(bios,uVar9 + 0x24,
                            (uint32_t *)
                            ((long)&(((bios->p).falcon_ucode.entries)->desc).dmem_offset + lVar23));
          uVar20 = bios_u32(bios,uVar9 + 0x28,
                            (uint32_t *)
                            ((long)&(((bios->p).falcon_ucode.entries)->desc).dmem_phys_base + lVar23
                            ));
          uVar9 = bios_u32(bios,uVar9 + 0x2c,
                           (uint32_t *)
                           ((long)&(((bios->p).falcon_ucode.entries)->desc).dmem_load_size + lVar23)
                          );
          uVar24 = uVar24 | uVar18 | uVar17 | uVar19 | uVar20 |
                            uVar15 | uVar14 | uVar16 | uVar13 | uVar12 | uVar11 | uVar10 | uVar9;
          peVar21 = (bios->p).falcon_ucode.entries;
          (&(peVar21->desc).valid)[lVar23] = uVar24 == 0;
        }
        bVar2 = *res;
        lVar23 = lVar23 + 0x40;
      }
      iVar4 = 0;
    }
    else {
      fprintf(_stderr,"Unknown FALCON UCODE table version 0x%x\n");
    }
  }
  return iVar4;
}

Assistant:

int
envy_bios_parse_p_falcon_ucode(struct envy_bios *bios)
{
	struct envy_bios_p_falcon_ucode *falcon_ucode = &bios->p.falcon_ucode;
	int i, err = 0;

	if (!falcon_ucode->offset)
		return -EINVAL;

	bios_u8(bios, falcon_ucode->offset + 0x0, &falcon_ucode->version);
	switch(falcon_ucode->version) {
	case 0x1:
		err |= bios_u8(bios, falcon_ucode->offset + 0x1, &falcon_ucode->hlen);
		err |= bios_u8(bios, falcon_ucode->offset + 0x2, &falcon_ucode->rlen);
		err |= bios_u8(bios, falcon_ucode->offset + 0x3, &falcon_ucode->entriesnum);

		err |= bios_u8(bios, falcon_ucode->offset + 0x4, &falcon_ucode->desc_version);
		err |= bios_u8(bios, falcon_ucode->offset + 0x5, &falcon_ucode->desc_size);
		falcon_ucode->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown FALCON UCODE table version 0x%x\n", falcon_ucode->version);
		return -EINVAL;
	};

	err = 0;
	falcon_ucode->entries = malloc(falcon_ucode->entriesnum * sizeof(struct envy_bios_p_falcon_ucode_entry));
	for (i = 0; i < falcon_ucode->entriesnum; i++) {
		uint32_t data = falcon_ucode->offset + falcon_ucode->hlen + i * falcon_ucode->rlen;

		falcon_ucode->entries[i].offset = data;
		err |= bios_u8(bios, data + 0x0, &falcon_ucode->entries[i].application_id);
		err |= bios_u8(bios, data + 0x1, &falcon_ucode->entries[i].target_id);
		err |= bios_u32(bios, data + 0x2, &falcon_ucode->entries[i].desc_ptr);

		if (falcon_ucode->entries[i].desc_ptr) {
			uint32_t suboffset = falcon_ucode->entries[i].desc_ptr;

			falcon_ucode->entries[i].desc.offset = suboffset;
			err |= bios_u32(bios, suboffset + 0x0, &falcon_ucode->entries[i].desc.stored_size);
			err |= bios_u32(bios, suboffset + 0x4, &falcon_ucode->entries[i].desc.uncompressed_size);
			err |= bios_u32(bios, suboffset + 0x8, &falcon_ucode->entries[i].desc.virtual_entry);
			err |= bios_u32(bios, suboffset + 0xc, &falcon_ucode->entries[i].desc.interface_offset);
			err |= bios_u32(bios, suboffset + 0x10, &falcon_ucode->entries[i].desc.imem_phys_base);
			err |= bios_u32(bios, suboffset + 0x14, &falcon_ucode->entries[i].desc.imem_load_size);
			err |= bios_u32(bios, suboffset + 0x18, &falcon_ucode->entries[i].desc.imem_virt_base);
			err |= bios_u32(bios, suboffset + 0x1c, &falcon_ucode->entries[i].desc.imem_sec_base);
			err |= bios_u32(bios, suboffset + 0x20, &falcon_ucode->entries[i].desc.imem_sec_size);
			err |= bios_u32(bios, suboffset + 0x24, &falcon_ucode->entries[i].desc.dmem_offset);
			err |= bios_u32(bios, suboffset + 0x28, &falcon_ucode->entries[i].desc.dmem_phys_base);
			err |= bios_u32(bios, suboffset + 0x2c, &falcon_ucode->entries[i].desc.dmem_load_size);
			falcon_ucode->entries[i].desc.valid = !err;
		}
	}

	return 0;
}